

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint rgba8ToPixel(uchar *out,size_t i,LodePNGColorMode *mode,ColorTree *tree,uchar r,uchar g,uchar b
                 ,uchar a)

{
  uint in;
  ColorTree *in_RCX;
  int *in_RDX;
  size_t in_RSI;
  uchar *in_RDI;
  byte in_R8B;
  uchar in_R9B;
  uchar in_stack_00000008;
  uchar in_stack_00000010;
  uchar gray_1;
  int index;
  uchar gray;
  
  if (*in_RDX == 0) {
    if (in_RDX[1] == 8) {
      in_RDI[in_RSI] = in_R8B;
    }
    else if (in_RDX[1] == 0x10) {
      in_RDI[in_RSI * 2 + 1] = in_R8B;
      in_RDI[in_RSI * 2] = in_R8B;
    }
    else {
      addColorBits(in_RDI,in_RSI,in_RDX[1],
                   (uint)(byte)(in_R8B >> (8U - (char)in_RDX[1] & 0x1f) &
                               (char)(1 << ((byte)in_RDX[1] & 0x1f)) - 1U));
    }
  }
  else if (*in_RDX == 2) {
    if (in_RDX[1] == 8) {
      in_RDI[in_RSI * 3] = in_R8B;
      in_RDI[in_RSI * 3 + 1] = in_R9B;
      in_RDI[in_RSI * 3 + 2] = in_stack_00000008;
    }
    else {
      in_RDI[in_RSI * 6 + 1] = in_R8B;
      in_RDI[in_RSI * 6] = in_R8B;
      in_RDI[in_RSI * 6 + 3] = in_R9B;
      in_RDI[in_RSI * 6 + 2] = in_R9B;
      in_RDI[in_RSI * 6 + 5] = in_stack_00000008;
      in_RDI[in_RSI * 6 + 4] = in_stack_00000008;
    }
  }
  else if (*in_RDX == 3) {
    in = color_tree_get(in_RCX,in_R8B,in_R9B,in_stack_00000008,in_stack_00000010);
    if ((int)in < 0) {
      return 0x52;
    }
    if (in_RDX[1] == 8) {
      in_RDI[in_RSI] = (uchar)in;
    }
    else {
      addColorBits(in_RDI,in_RSI,in_RDX[1],in);
    }
  }
  else if (*in_RDX == 4) {
    if (in_RDX[1] == 8) {
      in_RDI[in_RSI * 2] = in_R8B;
      in_RDI[in_RSI * 2 + 1] = in_stack_00000010;
    }
    else if (in_RDX[1] == 0x10) {
      in_RDI[in_RSI * 4 + 1] = in_R8B;
      in_RDI[in_RSI * 4] = in_R8B;
      in_RDI[in_RSI * 4 + 3] = in_stack_00000010;
      in_RDI[in_RSI * 4 + 2] = in_stack_00000010;
    }
  }
  else if (*in_RDX == 6) {
    if (in_RDX[1] == 8) {
      in_RDI[in_RSI * 4] = in_R8B;
      in_RDI[in_RSI * 4 + 1] = in_R9B;
      in_RDI[in_RSI * 4 + 2] = in_stack_00000008;
      in_RDI[in_RSI * 4 + 3] = in_stack_00000010;
    }
    else {
      in_RDI[in_RSI * 8 + 1] = in_R8B;
      in_RDI[in_RSI * 8] = in_R8B;
      in_RDI[in_RSI * 8 + 3] = in_R9B;
      in_RDI[in_RSI * 8 + 2] = in_R9B;
      in_RDI[in_RSI * 8 + 5] = in_stack_00000008;
      in_RDI[in_RSI * 8 + 4] = in_stack_00000008;
      in_RDI[in_RSI * 8 + 7] = in_stack_00000010;
      in_RDI[in_RSI * 8 + 6] = in_stack_00000010;
    }
  }
  return 0;
}

Assistant:

static unsigned rgba8ToPixel(unsigned char* out, size_t i,
                             const LodePNGColorMode* mode, ColorTree* tree /*for palette*/,
                             unsigned char r, unsigned char g, unsigned char b, unsigned char a) {
  if(mode->colortype == LCT_GREY) {
    unsigned char gray = r; /*((unsigned short)r + g + b) / 3u;*/
    if(mode->bitdepth == 8) out[i] = gray;
    else if(mode->bitdepth == 16) out[i * 2 + 0] = out[i * 2 + 1] = gray;
    else {
      /*take the most significant bits of gray*/
      gray = ((unsigned)gray >> (8u - mode->bitdepth)) & ((1u << mode->bitdepth) - 1u);
      addColorBits(out, i, mode->bitdepth, gray);
    }
  } else if(mode->colortype == LCT_RGB) {
    if(mode->bitdepth == 8) {
      out[i * 3 + 0] = r;
      out[i * 3 + 1] = g;
      out[i * 3 + 2] = b;
    } else {
      out[i * 6 + 0] = out[i * 6 + 1] = r;
      out[i * 6 + 2] = out[i * 6 + 3] = g;
      out[i * 6 + 4] = out[i * 6 + 5] = b;
    }
  } else if(mode->colortype == LCT_PALETTE) {
    int index = color_tree_get(tree, r, g, b, a);
    if(index < 0) return 82; /*color not in palette*/
    if(mode->bitdepth == 8) out[i] = index;
    else addColorBits(out, i, mode->bitdepth, (unsigned)index);
  } else if(mode->colortype == LCT_GREY_ALPHA) {
    unsigned char gray = r; /*((unsigned short)r + g + b) / 3u;*/
    if(mode->bitdepth == 8) {
      out[i * 2 + 0] = gray;
      out[i * 2 + 1] = a;
    } else if(mode->bitdepth == 16) {
      out[i * 4 + 0] = out[i * 4 + 1] = gray;
      out[i * 4 + 2] = out[i * 4 + 3] = a;
    }
  } else if(mode->colortype == LCT_RGBA) {
    if(mode->bitdepth == 8) {
      out[i * 4 + 0] = r;
      out[i * 4 + 1] = g;
      out[i * 4 + 2] = b;
      out[i * 4 + 3] = a;
    } else {
      out[i * 8 + 0] = out[i * 8 + 1] = r;
      out[i * 8 + 2] = out[i * 8 + 3] = g;
      out[i * 8 + 4] = out[i * 8 + 5] = b;
      out[i * 8 + 6] = out[i * 8 + 7] = a;
    }
  }

  return 0; /*no error*/
}